

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callbacks.c
# Opt level: O1

int enet_initialize_with_callbacks(ENetVersion version,ENetCallbacks *inits)

{
  _func_void_ptr_size_t *p_Var1;
  _func_void_void_ptr *p_Var2;
  int iVar3;
  
  if (0x102ff < version) {
    if (inits->malloc == (_func_void_ptr_size_t *)0x0) {
      p_Var1 = (_func_void_ptr_size_t *)callbacks_0;
      p_Var2 = (_func_void_void_ptr *)callbacks_1;
      if (inits->free == (_func_void_void_ptr *)0x0) goto LAB_0015ef2b;
    }
    else {
      p_Var1 = inits->malloc;
      p_Var2 = inits->free;
      if (inits->free != (_func_void_void_ptr *)0x0) {
LAB_0015ef2b:
        callbacks_1 = p_Var2;
        callbacks_0 = p_Var1;
        if (inits->no_memory != (_func_void *)0x0) {
          callbacks_2 = inits->no_memory;
          iVar3 = enet_initialize();
          return iVar3;
        }
        return 0;
      }
    }
  }
  return -1;
}

Assistant:

int
enet_initialize_with_callbacks (ENetVersion version, const ENetCallbacks * inits)
{
   if (version < ENET_VERSION_CREATE (1, 3, 0))
     return -1;

   if (inits -> malloc != NULL || inits -> free != NULL)
   {
      if (inits -> malloc == NULL || inits -> free == NULL)
        return -1;

      callbacks.malloc = inits -> malloc;
      callbacks.free = inits -> free;
   }
      
   if (inits -> no_memory != NULL)
     callbacks.no_memory = inits -> no_memory;

   return enet_initialize ();
}